

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

bool __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Pop
          (PageStack<Memory::MarkContext::MarkCandidate> *this,MarkCandidate *item)

{
  code *pcVar1;
  bool bVar2;
  Chunk *pCVar3;
  Chunk *pCVar4;
  size_t sVar5;
  Chunk *pCVar6;
  undefined4 *puVar7;
  undefined8 *in_FS_OFFSET;
  
  if (this->currentChunk == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)*in_FS_OFFSET;
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x4b,"(currentChunk != nullptr)","currentChunk != nullptr");
    if (!bVar2) goto LAB_0029cdb5;
    *puVar7 = 0;
  }
  pCVar3 = (Chunk *)this->nextEntry;
  pCVar6 = (Chunk *)this->chunkStart;
  if (pCVar3 == pCVar6) {
    pCVar6 = this->currentChunk;
    pCVar3 = pCVar6->nextChunk;
    if (pCVar3 == (Chunk *)0x0) {
      if (this->count == 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)*in_FS_OFFSET;
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x53,"(count == 0)","count == 0");
      if (!bVar2) goto LAB_0029cdb5;
      bVar2 = false;
      goto LAB_0029cd50;
    }
    this->currentChunk = pCVar3;
    FreeChunk(this,pCVar6);
    pCVar6 = this->currentChunk + 1;
    this->chunkStart = (MarkCandidate *)pCVar6;
    pCVar3 = this->currentChunk + 0x80;
    this->chunkEnd = (MarkCandidate *)pCVar3;
    this->nextEntry = (MarkCandidate *)pCVar3;
    pCVar4 = pCVar3;
  }
  else {
    pCVar4 = (Chunk *)this->chunkEnd;
  }
  if ((pCVar3 <= pCVar6) || (pCVar4 < pCVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)*in_FS_OFFSET;
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x60,"(nextEntry > chunkStart && nextEntry <= chunkEnd)",
                       "nextEntry > chunkStart && nextEntry <= chunkEnd");
    if (!bVar2) goto LAB_0029cdb5;
    *puVar7 = 0;
    pCVar3 = (Chunk *)this->nextEntry;
  }
  this->nextEntry = (MarkCandidate *)&pCVar3[-1].super_PagePoolPage.isReserved;
  pCVar6 = pCVar3[-1].nextChunk;
  item->obj = *(void ***)&pCVar3[-1].super_PagePoolPage.isReserved;
  item->byteCount = (size_t)pCVar6;
  sVar5 = this->count - 1;
  this->count = sVar5;
  if (sVar5 == (this->pageCount * 0xfe + ((long)this->nextEntry - (long)this->chunkStart >> 4)) -
               0xfe) {
    return true;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)*in_FS_OFFSET;
  *puVar7 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                     ,0x6a,"(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)"
                     ,"count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
  if (bVar2) {
    bVar2 = true;
LAB_0029cd50:
    *puVar7 = 0;
    return bVar2;
  }
LAB_0029cdb5:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

inline
bool PageStack<T>::Pop(T * item)
{
    Assert(currentChunk != nullptr);

    if (nextEntry == chunkStart)
    {
        // We're at the beginning of the chunk.  Move to the previous chunk, if any
        if (currentChunk->nextChunk == nullptr)
        {
            // All done
            Assert(count == 0);
            return false;
        }

        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkEnd;
    }

    Assert(nextEntry > chunkStart && nextEntry <= chunkEnd);

    nextEntry--;
#if defined(_M_IX86) || defined(_M_X64)
    _mm_prefetch((char*) (nextEntry - 1), _MM_HINT_T0);
#endif
    *item = *nextEntry;

#if DBG
    count--;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}